

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  
  uVar3 = other.size_;
  uVar1 = this->size_;
  __n = uVar3;
  if (uVar1 < uVar3) {
    __n = uVar1;
  }
  uVar2 = memcmp(this->data_,other.data_,__n);
  if ((uVar2 == 0) && (uVar2 = 0, uVar1 != uVar3)) {
    uVar2 = -(uint)(uVar1 < uVar3) | 1;
  }
  return uVar2;
}

Assistant:

nssv_constexpr14 int compare( basic_string_view other ) const nssv_noexcept // (1)
    {
#if nssv_CPP17_OR_GREATER
        if ( const int result = Traits::compare( data(), other.data(), (std::min)( size(), other.size() ) ) )
#else
        if ( const int result = detail::compare( data(), other.data(), (std::min)( size(), other.size() ) ) )
#endif
        {
            return result;
        }

        return size() == other.size() ? 0 : size() < other.size() ? -1 : 1;
    }